

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  undefined1 local_40 [8];
  ucvector header;
  uint error;
  uint interlace_method_local;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  ucvector *out_local;
  
  header.allocsize._0_4_ = 0;
  header.allocsize._4_4_ = interlace_method;
  ucvector_init((ucvector *)local_40);
  lodepng_add32bitInt((ucvector *)local_40,w);
  lodepng_add32bitInt((ucvector *)local_40,h);
  ucvector_push_back((ucvector *)local_40,(uchar)bitdepth);
  ucvector_push_back((ucvector *)local_40,(uchar)colortype);
  ucvector_push_back((ucvector *)local_40,'\0');
  ucvector_push_back((ucvector *)local_40,'\0');
  ucvector_push_back((ucvector *)local_40,(uchar)header.allocsize._4_4_);
  header.allocsize._0_4_ = addChunk(out,"IHDR",(uchar *)local_40,(size_t)header.data);
  ucvector_cleanup(local_40);
  return (uint)header.allocsize;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method)
{
  unsigned error = 0;
  ucvector header;
  ucvector_init(&header);

  lodepng_add32bitInt(&header, w); /*width*/
  lodepng_add32bitInt(&header, h); /*height*/
  ucvector_push_back(&header, (unsigned char)bitdepth); /*bit depth*/
  ucvector_push_back(&header, (unsigned char)colortype); /*color type*/
  ucvector_push_back(&header, 0); /*compression method*/
  ucvector_push_back(&header, 0); /*filter method*/
  ucvector_push_back(&header, interlace_method); /*interlace method*/

  error = addChunk(out, "IHDR", header.data, header.size);
  ucvector_cleanup(&header);

  return error;
}